

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void __thiscall E64::command_t::memory_dump(command_t *this,uint32_t address,int rows)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  tty_t *ptVar4;
  int i;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  if (0 < rows) {
    uVar7 = address & 0xfffffffe;
    iVar2 = 0;
    ptVar4 = monitor.tty;
    do {
      uVar3 = (ulong)uVar7;
      tty_t::print(ptVar4,"\r:%06x ",uVar3);
      uVar5 = 0;
      do {
        ptVar4 = monitor.tty;
        uVar1 = mmu_ic::read_memory_8(machine.mmu,(uint)uVar3);
        tty_t::print(ptVar4,"%02x",(ulong)uVar1);
        if ((uVar5 & 1) != 0) {
          tty_t::putchar(monitor.tty,0x20);
        }
        uVar3 = (ulong)((uint)uVar3 + 1 & 0xffffff);
        uVar5 = uVar5 + 1;
      } while (uVar5 != 8);
      (monitor.tty)->current_background_color = 0x24f2;
      iVar6 = 0;
      do {
        uVar5 = mmu_ic::read_memory_8(machine.mmu,uVar7 + iVar6);
        tty_t::put_screencode(monitor.tty,(char)uVar5);
        ptVar4 = monitor.tty;
        iVar6 = iVar6 + 1;
      } while (iVar6 != 8);
      (monitor.tty)->current_background_color = 0x12f1;
      ptVar4->cursor_pos = ptVar4->cursor_pos + -0x1c;
      uVar7 = uVar7 + 8 & 0xffffff;
      iVar2 = iVar2 + 1;
    } while (iVar2 != rows);
  }
  return;
}

Assistant:

void E64::command_t::memory_dump(uint32_t address, int rows)
{
    address = address & 0xfffffffe;  // only even addresses allowed
    
	for (int i=0; i<rows; i++ ) {
		uint32_t temp_address = address;
		monitor.tty->print("\r:%06x ", temp_address);
		for (int i=0; i<8; i++) {
			monitor.tty->print("%02x", machine.mmu->read_memory_8(temp_address));
			if(i & 0b1) monitor.tty->putchar(' ');
			temp_address ++;
			temp_address &= RAM_SIZE - 1;
		}
        
		monitor.tty->current_background_color = COBALT_02;
		
		temp_address = address;
		for (int i=0; i<8; i++) {
			uint8_t temp_byte = machine.mmu->read_memory_8(temp_address);
			monitor.tty->put_screencode(temp_byte);
			temp_address++;
		}
		address += 8;
		address &= RAM_SIZE - 1;
        
		monitor.tty->current_background_color = COBALT_01;
       
		monitor.tty->cursor_pos -= 28;
	}
}